

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

void __thiscall
CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~CLParam
          (CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RDI;
  
  ~CLParam(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~CLParam() {}